

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O2

char * __thiscall FHistory::Trim_filename(FHistory *this,char *s,int stops)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  
  sVar1 = strlen(s);
  pcVar2 = s + (int)sVar1;
  while ((pcVar3 = pcVar2 + -1, stops != 0 && (s < pcVar3))) {
    pcVar2 = pcVar3;
    if ((*pcVar3 == '\\') || (*pcVar3 == '/')) {
      stops = stops + -1;
    }
  }
  pcVar2 = pcVar2 + 1;
  if (stops != 0) {
    pcVar2 = pcVar3;
  }
  return pcVar2;
}

Assistant:

char *FHistory::Trim_filename(char *s, int stops) {

	int l   = strlen(s);
	char *p = s + l - 1;

	while ((stops) && (p > s)) {
		if ((*p == '/') || (*p == '\\')) stops--;
		p--;
	}
	if (!stops) p += 2;

	return p;
}